

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O1

void __thiscall
helics::FirewallFilterOperation::FirewallFilterOperation(FirewallFilterOperation *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  (this->super_FilterOperations)._vptr_FilterOperations =
       (_func_int **)&PTR__FirewallFilterOperation_004cc968;
  (this->op).super___shared_ptr<helics::FirewallOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_004cce70;
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<bool_(const_helics::Message_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FilterOperations.cpp:428:9)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(const_helics::Message_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FilterOperations.cpp:428:9)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  FirewallOperator::FirewallOperator
            ((FirewallOperator *)(p_Var1 + 1),(function<bool_(const_helics::Message_*)> *)&local_38)
  ;
  if (local_28 != (code *)0x0) {
    (*local_28)((_Any_data *)&local_38,(_Any_data *)&local_38,__destroy_functor);
  }
  (this->op).super___shared_ptr<helics::FirewallOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  (this->op).super___shared_ptr<helics::FirewallOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (FirewallOperator *)(p_Var1 + 1);
  gmlc::libguarded::
  cow_guarded<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::mutex>
  ::cow_guarded<>(&this->allowed);
  gmlc::libguarded::
  cow_guarded<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::mutex>
  ::cow_guarded<>(&this->blocked);
  return;
}

Assistant:

FirewallFilterOperation::FirewallFilterOperation():
    op(std::make_shared<FirewallOperator>(
        [this](const Message* mess) { return allowPassed(mess); }))
{
}